

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_proxy_isArray(JSContext *ctx,JSValue obj)

{
  int iVar1;
  JSValue *pJVar2;
  
  iVar1 = 0;
  if (((int)obj.tag == -1) && (*(short *)((long)obj.u.ptr + 6) == 0x29)) {
    pJVar2 = *(JSValue **)((long)obj.u.ptr + 0x30);
  }
  else {
    pJVar2 = (JSValue *)0x0;
  }
  if (pJVar2 != (JSValue *)0x0) {
    if (*(char *)((long)&pJVar2[2].u + 1) == '\0') {
      iVar1 = JS_IsArray(ctx,*pJVar2);
      return iVar1;
    }
    JS_ThrowTypeError(ctx,"revoked proxy");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int js_proxy_isArray(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s = JS_GetOpaque(obj, JS_CLASS_PROXY);
    if (!s)
        return FALSE;
    if (s->is_revoked) {
        JS_ThrowTypeErrorRevokedProxy(ctx);
        return -1;
    }
    return JS_IsArray(ctx, s->target);
}